

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcEdgeFeature::IfcEdgeFeature(IfcEdgeFeature *this)

{
  IfcEdgeFeature *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x178,"IfcEdgeFeature");
  IfcFeatureElementSubtraction::IfcFeatureElementSubtraction
            (&this->super_IfcFeatureElementSubtraction,&PTR_construction_vtable_24__00f04e58);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcEdgeFeature,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcEdgeFeature,_1UL> *)
             &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.field_0x158,
             &PTR_construction_vtable_24__00f04fe0);
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.super_IfcObject = 0xf04d00;
  *(undefined8 *)&this->field_0x178 = 0xf04e40;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x88 = 0xf04d28;
  (this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0xf04d50;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0xf04d78;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.field_0x100 = 0xf04da0;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.field_0x138
       = 0xf04dc8;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.field_0x148
       = 0xf04df0;
  *(undefined8 *)&(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.field_0x158 =
       0xf04e18;
  STEP::Maybe<double>::Maybe
            ((Maybe<double> *)&(this->super_IfcFeatureElementSubtraction).field_0x168);
  return;
}

Assistant:

IfcEdgeFeature() : Object("IfcEdgeFeature") {}